

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int exhaustive_mesh_search
              (FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int range,int step,
              FULLPEL_MV *best_mv,FULLPEL_MV *second_best_mv)

{
  MV_COST_PARAMS *mv_cost_params;
  buf_2d *pbVar1;
  buf_2d *pbVar2;
  int iVar3;
  FULLPEL_MV FVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  short sVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  short sVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  uint local_f8;
  int local_f4;
  FULLPEL_MOTION_SEARCH_PARAMS *local_f0;
  int local_e4;
  int local_e0;
  FULLPEL_MV mv_2;
  FULLPEL_MV start_mv_local;
  FULLPEL_MV mv;
  uint sads [4];
  
  mv_cost_params = &ms_params->mv_cost_params;
  pbVar1 = (ms_params->ms_buffers).ref;
  pbVar2 = (ms_params->ms_buffers).src;
  local_f4 = pbVar1->stride;
  iVar3 = 4;
  if (1 < step) {
    iVar3 = step;
  }
  local_e4 = step;
  start_mv_local = start_mv;
  clamp_fullmv(&start_mv_local,&ms_params->mv_limits);
  FVar4 = start_mv_local;
  *best_mv = start_mv_local;
  sVar13 = start_mv_local.row;
  iVar21 = (int)sVar13;
  uVar20 = (uint)start_mv_local >> 0x10;
  iVar14 = (int)start_mv_local >> 0x10;
  uVar5 = (*ms_params->sdf)(pbVar2->buf,pbVar2->stride,
                            pbVar1->buf + (pbVar1->stride * iVar21 + iVar14),local_f4);
  local_f0 = (FULLPEL_MOTION_SEARCH_PARAMS *)CONCAT44(local_f0._4_4_,uVar5);
  iVar6 = mvsad_err_cost_(&start_mv_local,mv_cost_params);
  local_f8 = iVar6 + (int)local_f0;
  iVar7 = -range;
  iVar6 = (ms_params->mv_limits).row_min - iVar21;
  if (iVar6 == iVar7 || SBORROW4(iVar6,iVar7) != iVar6 + range < 0) {
    iVar6 = iVar7;
  }
  iVar10 = (ms_params->mv_limits).col_min - iVar14;
  if (iVar10 == iVar7 || SBORROW4(iVar10,iVar7) != iVar10 + range < 0) {
    iVar10 = iVar7;
  }
  iVar21 = (ms_params->mv_limits).row_max - iVar21;
  if (range <= iVar21) {
    iVar21 = range;
  }
  local_e0 = (ms_params->mv_limits).col_max - iVar14;
  if (range <= local_e0) {
    local_e0 = range;
  }
  iVar7 = local_e0 - iVar10;
  iVar14 = uVar20 + iVar10;
  local_f0 = ms_params;
  for (; iVar6 <= iVar21; iVar6 = iVar6 + local_e4) {
    sVar19 = sVar13 + (short)iVar6;
    iVar8 = (int)sVar19;
    iVar15 = iVar14 * 0x10000;
    iVar9 = iVar7;
    iVar11 = iVar10;
    iVar17 = iVar14;
    while( true ) {
      iVar22 = 0;
      if (0 < iVar9) {
        iVar22 = iVar9;
      }
      if (local_e0 < iVar11) break;
      if (local_e4 < 2) {
        if (local_e0 < iVar11 + 3) {
          iVar16 = iVar15;
          iVar18 = iVar17;
          for (iVar22 = -iVar22; iVar22 != 0; iVar22 = iVar22 + 1) {
            mv.col = (int16_t)iVar18;
            mv.row = sVar19;
            uVar5 = (*local_f0->sdf)(pbVar2->buf,pbVar2->stride,
                                     pbVar1->buf + ((iVar16 >> 0x10) + pbVar1->stride * iVar8),
                                     local_f4);
            update_mvs_and_sad(uVar5,&mv,mv_cost_params,&local_f8,(uint *)0x0,best_mv,second_best_mv
                              );
            iVar16 = iVar16 + 0x10000;
            iVar18 = iVar18 + 1;
          }
        }
        else {
          iVar22 = pbVar1->stride;
          iVar16 = iVar15;
          for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
            *(uint8_t **)(&mv + lVar12 * 2) = pbVar1->buf + ((iVar16 >> 0x10) + iVar22 * iVar8);
            iVar16 = iVar16 + 0x10000;
          }
          (*local_f0->sdx4df)(pbVar2->buf,pbVar2->stride,(uint8_t **)&mv,local_f4,sads);
          for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
            if (sads[lVar12] < local_f8) {
              mv_2.col = (short)iVar17 + (short)lVar12;
              mv_2.row = sVar19;
              update_mvs_and_sad(sads[lVar12],&mv_2,mv_cost_params,&local_f8,(uint *)0x0,best_mv,
                                 second_best_mv);
            }
          }
        }
      }
      else {
        mv.col = FVar4.col + (short)iVar11;
        mv.row = sVar19;
        uVar5 = (*local_f0->sdf)(pbVar2->buf,pbVar2->stride,
                                 pbVar1->buf + ((int)mv.col + pbVar1->stride * iVar8),local_f4);
        update_mvs_and_sad(uVar5,&mv,mv_cost_params,&local_f8,(uint *)0x0,best_mv,second_best_mv);
      }
      iVar11 = iVar11 + iVar3;
      iVar9 = iVar9 - iVar3;
      iVar15 = iVar15 + iVar3 * 0x10000;
      iVar17 = iVar17 + iVar3;
    }
  }
  return local_f8;
}

Assistant:

static int exhaustive_mesh_search(FULLPEL_MV start_mv,
                                  const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                                  const int range, const int step,
                                  FULLPEL_MV *best_mv,
                                  FULLPEL_MV *second_best_mv) {
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const int ref_stride = ref->stride;
  unsigned int best_sad = INT_MAX;
  int r, c, i;
  int start_col, end_col, start_row, end_row;
  const int col_step = (step > 1) ? step : 4;

  assert(step >= 1);

  clamp_fullmv(&start_mv, &ms_params->mv_limits);
  *best_mv = start_mv;
  best_sad = get_mvpred_sad(ms_params, src, get_buf_from_fullmv(ref, &start_mv),
                            ref_stride);
  best_sad += mvsad_err_cost_(&start_mv, mv_cost_params);
  start_row = AOMMAX(-range, ms_params->mv_limits.row_min - start_mv.row);
  start_col = AOMMAX(-range, ms_params->mv_limits.col_min - start_mv.col);
  end_row = AOMMIN(range, ms_params->mv_limits.row_max - start_mv.row);
  end_col = AOMMIN(range, ms_params->mv_limits.col_max - start_mv.col);

  for (r = start_row; r <= end_row; r += step) {
    for (c = start_col; c <= end_col; c += col_step) {
      // Step > 1 means we are not checking every location in this pass.
      if (step > 1) {
        const FULLPEL_MV mv = { start_mv.row + r, start_mv.col + c };
        unsigned int sad = get_mvpred_sad(
            ms_params, src, get_buf_from_fullmv(ref, &mv), ref_stride);
        update_mvs_and_sad(sad, &mv, mv_cost_params, &best_sad,
                           /*raw_best_sad=*/NULL, best_mv, second_best_mv);
      } else {
        // 4 sads in a single call if we are checking every location
        if (c + 3 <= end_col) {
          unsigned int sads[4];
          const uint8_t *addrs[4];
          for (i = 0; i < 4; ++i) {
            const FULLPEL_MV mv = { start_mv.row + r, start_mv.col + c + i };
            addrs[i] = get_buf_from_fullmv(ref, &mv);
          }

          ms_params->sdx4df(src->buf, src->stride, addrs, ref_stride, sads);

          for (i = 0; i < 4; ++i) {
            if (sads[i] < best_sad) {
              const FULLPEL_MV mv = { start_mv.row + r, start_mv.col + c + i };
              update_mvs_and_sad(sads[i], &mv, mv_cost_params, &best_sad,
                                 /*raw_best_sad=*/NULL, best_mv,
                                 second_best_mv);
            }
          }
        } else {
          for (i = 0; i < end_col - c; ++i) {
            const FULLPEL_MV mv = { start_mv.row + r, start_mv.col + c + i };
            unsigned int sad = get_mvpred_sad(
                ms_params, src, get_buf_from_fullmv(ref, &mv), ref_stride);
            update_mvs_and_sad(sad, &mv, mv_cost_params, &best_sad,
                               /*raw_best_sad=*/NULL, best_mv, second_best_mv);
          }
        }
      }
    }
  }

  return best_sad;
}